

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type_PointerTuple.cpp
# Opt level: O2

string * __thiscall
Type_PointerTuple::SoftPrint_abi_cxx11_(string *__return_storage_ptr__,Type_PointerTuple *this)

{
  ostream *poVar1;
  stringstream ss;
  string local_1c0;
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::operator<<(local_190,"(");
  if (this->_m_pred != (TypeCluster *)0x0) {
    TypeCluster::SoftPrint_abi_cxx11_(&local_1c0,this->_m_pred);
    std::operator<<(local_190,(string *)&local_1c0);
    std::__cxx11::string::~string((string *)&local_1c0);
  }
  poVar1 = std::operator<<(local_190,"aI=");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,",oI=");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::operator<<(poVar1,")");
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

string Type_PointerTuple::SoftPrint() const
{
    stringstream ss;
    ss <<"(";
    if(_m_pred != 0)
    {
        ss << _m_pred->SoftPrint();
    }
    ss << "aI=" << _m_aI << ",oI="<< _m_oI << ")";
    return(ss.str());
}